

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O2

bool __thiscall
ELFIO::segment_impl<ELFIO::Elf32_Phdr>::load
          (segment_impl<ELFIO::Elf32_Phdr> *this,istream *stream,streampos header_offset,
          bool is_lazy_)

{
  bool bVar1;
  size_t sVar2;
  address_translator *this_00;
  streampos sVar3;
  
  this->pstream = stream;
  this->is_lazy = is_lazy_;
  this_00 = this->translator;
  if ((this_00->addr_translations).
      super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this_00->addr_translations).
      super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::istream::seekg((long)stream,_S_beg);
    sVar2 = std::istream::tellg();
    this_00 = this->translator;
  }
  else {
    sVar2 = 0xffffffffffffffff;
  }
  this->stream_size = sVar2;
  sVar3 = address_translator::operator[](this_00,header_offset);
  std::istream::seekg(stream,sVar3._M_off,sVar3._M_state);
  std::istream::read((char *)stream,(long)&this->ph);
  this->is_offset_set = true;
  if ((this->is_lazy == false) && (this->is_loaded == false)) {
    bVar1 = load_data(this);
    return bVar1;
  }
  return true;
}

Assistant:

bool load( std::istream&  stream,
               std::streampos header_offset,
               bool           is_lazy_ ) override
    {
        pstream = &stream;
        is_lazy = is_lazy_;

        if ( translator->empty() ) {
            stream.seekg( 0, std::istream::end );
            set_stream_size( size_t( stream.tellg() ) );
        }
        else {
            set_stream_size( std::numeric_limits<size_t>::max() );
        }

        stream.seekg( ( *translator )[header_offset] );
        stream.read( reinterpret_cast<char*>( &ph ), sizeof( ph ) );

        is_offset_set = true;

        if ( !( is_lazy || is_loaded ) ) {
            return load_data();
        }

        return true;
    }